

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

int mz_deflateReset(mz_streamp pStream)

{
  mz_streamp pStream_local;
  
  if ((((pStream == (mz_streamp)0x0) || (pStream->state == (mz_internal_state *)0x0)) ||
      (pStream->zalloc == (mz_alloc_func)0x0)) || (pStream->zfree == (mz_free_func)0x0)) {
    pStream_local._4_4_ = -2;
  }
  else {
    pStream->total_out = 0;
    pStream->total_in = 0;
    tdefl_init((tdefl_compressor *)pStream->state,(tdefl_put_buf_func_ptr)0x0,(void *)0x0,
               *(int *)(pStream->state + 0x10));
    pStream_local._4_4_ = 0;
  }
  return pStream_local._4_4_;
}

Assistant:

int mz_deflateReset(mz_streamp pStream) {
  if ((!pStream) || (!pStream->state) || (!pStream->zalloc) ||
      (!pStream->zfree))
    return MZ_STREAM_ERROR;
  pStream->total_in = pStream->total_out = 0;
  tdefl_init((tdefl_compressor *)pStream->state, NULL, NULL,
             ((tdefl_compressor *)pStream->state)->m_flags);
  return MZ_OK;
}